

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  size_type sVar1;
  int completeSubgraphs;
  ActionTest actionTest;
  DynamicGraphTest graphTest;
  variables_map args;
  PathCompleteGraphsBenchmark local_270;
  DynamicGraphTest local_178;
  variables_map local_b0 [16];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_a0 [144];
  
  parseArguments((int)local_b0,(char **)(ulong)(uint)argc);
  std::__cxx11::string::string((string *)&local_270,"test",(allocator *)&local_178);
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_a0,(key_type *)&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  if (sVar1 != 0) {
    ActionTest::ActionTest((ActionTest *)&local_270);
    DynamicGraphTest::DynamicGraphTest(&local_178);
    ActionTest::run((ActionTest *)&local_270);
    DynamicGraphTest::run(&local_178);
    DynamicGraphTest::~DynamicGraphTest(&local_178);
    ActionTest::~ActionTest((ActionTest *)&local_270);
  }
  std::__cxx11::string::string((string *)&local_270,"benchmark",(allocator *)&local_178);
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_a0,(key_type *)&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  if (sVar1 != 0) {
    std::__cxx11::string::string((string *)&local_270,"path",(allocator *)&local_178);
    sVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count(local_a0,(key_type *)&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    if (sVar1 != 0) {
      PathBenchmark::PathBenchmark((PathBenchmark *)&local_270,vertices);
      PathBenchmark::run((PathBenchmark *)&local_270,deletions,queries);
      Benchmark::~Benchmark(&local_270.super_Benchmark);
    }
    std::__cxx11::string::string((string *)&local_270,"tree",(allocator *)&local_178);
    sVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count(local_a0,(key_type *)&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    if (sVar1 != 0) {
      TreeBenchmark::TreeBenchmark((TreeBenchmark *)&local_270,vertices);
      TreeBenchmark::run((TreeBenchmark *)&local_270,deletions,queries);
      Benchmark::~Benchmark(&local_270.super_Benchmark);
    }
    std::__cxx11::string::string((string *)&local_270,"random",(allocator *)&local_178);
    sVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count(local_a0,(key_type *)&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    if (sVar1 != 0) {
      RandomGraphBenchmark::RandomGraphBenchmark((RandomGraphBenchmark *)&local_270,vertices,edges);
      RandomGraphBenchmark::run((RandomGraphBenchmark *)&local_270,deletions,queries);
      Benchmark::~Benchmark(&local_270.super_Benchmark);
    }
    std::__cxx11::string::string((string *)&local_270,"path-complete",(allocator *)&local_178);
    sVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count(local_a0,(key_type *)&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    if (sVar1 != 0) {
      completeSubgraphs =
           (int)SQRT(((double)CONCAT44(0x45300000,(int)(vertices >> 0x20)) - 1.9342813113834067e+25)
                     + ((double)CONCAT44(0x43300000,(int)vertices) - 4503599627370496.0));
      PathCompleteGraphsBenchmark::PathCompleteGraphsBenchmark
                (&local_270,completeSubgraphs,completeSubgraphs);
      PathCompleteGraphsBenchmark::run(&local_270,deletions,queries);
      PathCompleteGraphsBenchmark::~PathCompleteGraphsBenchmark(&local_270);
    }
  }
  std::__cxx11::string::string((string *)&local_270,"example",(allocator *)&local_178);
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_a0,(key_type *)&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  if (sVar1 != 0) {
    runExample();
  }
  boost::program_options::variables_map::~variables_map(local_b0);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    boost::program_options::variables_map args = parseArguments(argc, argv);

    if (args.count("test")) {
        ActionTest actionTest;
        DynamicGraphTest graphTest;
        actionTest.run();
        graphTest.run();
    }
    if (args.count("benchmark")) {
        if (args.count("path")) {
            PathBenchmark pathBenchmark(vertices);
            pathBenchmark.run(deletions, queries);
        }
        if (args.count("tree")) {
            TreeBenchmark treeBenchmark(vertices);
            treeBenchmark.run(deletions, queries);
        }
        if (args.count("random")) {
            RandomGraphBenchmark randomGraphBenchmark(vertices, edges);
            randomGraphBenchmark.run(deletions, queries);
        }
        if (args.count("path-complete")) {
            PathCompleteGraphsBenchmark pathCompleteGraphsBenchmark(
                    static_cast<int>(sqrt(vertices)),
                    static_cast<int>(sqrt(vertices)));
            pathCompleteGraphsBenchmark.run(deletions, queries);
        }
    }
    if (args.count("example")) {
        runExample();
    }

    return 0;
}